

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_builder_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::subject::
SubjectBuilderTest_test_component_keys_are_added_alphabetically_Test::
SubjectBuilderTest_test_component_keys_are_added_alphabetically_Test
          (SubjectBuilderTest_test_component_keys_are_added_alphabetically_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0026cbe0;
  return;
}

Assistant:

TEST(SubjectBuilderTest, test_component_keys_are_added_alphabetically)
{
    SubjectBuilder subject_builder = SubjectBuilder();

    subject_builder
            .SetComponent("Level", "1")
            .SetComponent("Symbol", "VOD.L")
            .SetComponent("Source", "Reuters")
            .SetComponent("AssetClass", "Equity");

    std::vector<std::string> output = subject_builder.GetComponents();

    EXPECT_STREQ(output.at(0).c_str(), "AssetClass");
    EXPECT_STREQ(output.at(2).c_str(), "Level");
    EXPECT_STREQ(output.at(4).c_str(), "Source");
    EXPECT_STREQ(output.at(6).c_str(), "Symbol");
}